

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

int parse_tdp_token_chain(simple_token *chain)

{
  simple_token *local_38;
  simple_token *result;
  simple_token *remainder;
  simple_token *walker;
  void *pParser;
  simple_token *chain_local;
  
  pParser = chain;
  walker = (simple_token *)TDPParseAlloc(malloc);
  remainder = *(simple_token **)((long)pParser + 0x18);
  local_38 = (simple_token *)0x0;
  fprintf(_stderr,"\n");
  TDPParseTrace((FILE *)_stderr,"parser >>");
  while (remainder != (simple_token *)0x0) {
    result = remainder->next;
    remainder->next = (simple_token *)0x0;
    remainder->tail = remainder;
    if (result != (simple_token *)0x0) {
      result->prev = (simple_token *)0x0;
    }
    TDPParse(walker,(uint)remainder->type,remainder,&local_38);
    remainder = result;
  }
  TDPParse(walker,0,(simple_token *)0x0,&local_38);
  TDPParseFree(walker,free);
  if (local_38 == (simple_token *)0x0) {
    chain_local._4_4_ = -1;
  }
  else {
    *(undefined8 *)((long)pParser + 0x18) = 0;
    *(simple_token **)((long)pParser + 0x28) = local_38;
    chain_local._4_4_ = 0;
  }
  return chain_local._4_4_;
}

Assistant:

int parse_tdp_token_chain(simple_token * chain) {

	// Parser
	void * pParser = TDPParseAlloc (malloc);
	simple_token * walker = chain->next;
	simple_token * remainder;

	simple_token * result = NULL;

#ifndef NDEBUG
	fprintf(stderr, "\n");
	TDPParseTrace(stderr, "parser >>");
#endif

	while (walker != NULL) {
		remainder = walker->next;

		// Snip token from remainder
		walker->next = NULL;
		walker->tail = walker;

		if (remainder) {
			remainder->prev = NULL;
		}

		TDPParse(pParser, walker->type, walker, &result);

		walker = remainder;
	}

	// Signal that we're done
	TDPParse(pParser, 0, NULL, &result);

	TDPParseFree(pParser, free);

	if (result) {
		// Success
		chain->next = NULL;
		chain->child = result;
		return 0;
	} else {
		// Failed
		return -1;
	}
}